

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::hugeint_t,unsigned_int,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::ExtractVersionUuidOperator>>
               (hugeint_t *ldata,uint *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  Vector *vector;
  ulong uVar6;
  int64_t *piVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar7 = &ldata->upper;
    for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
      input.upper = *piVar7;
      input.lower = ((hugeint_t *)(piVar7 + -1))->lower;
      uVar3 = ExtractVersionUuidOperator::Operation<duckdb::hugeint_t,unsigned_int>
                        (input,(Vector *)dataptr);
      result_data[iVar8] = uVar3;
      piVar7 = piVar7 + 2;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    uVar6 = 0;
    for (uVar5 = 0; uVar5 != count + 0x3f >> 6; uVar5 = uVar5 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar9 = count;
        }
LAB_00797d0b:
        piVar7 = &ldata[uVar6].upper;
        for (; uVar4 = uVar6, uVar6 < uVar9; uVar6 = uVar6 + 1) {
          input_00.upper = *piVar7;
          input_00.lower = ((hugeint_t *)(piVar7 + -1))->lower;
          uVar3 = ExtractVersionUuidOperator::Operation<duckdb::hugeint_t,unsigned_int>
                            (input_00,(Vector *)dataptr);
          result_data[uVar6] = uVar3;
          piVar7 = piVar7 + 2;
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar9 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar9 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_00797d0b;
        uVar4 = uVar9;
        if (uVar2 != 0) {
          piVar7 = &ldata[uVar6].upper;
          for (uVar10 = 0; uVar4 = uVar10 + uVar6, uVar10 + uVar6 < uVar9; uVar10 = uVar10 + 1) {
            if ((uVar2 >> (uVar10 & 0x3f) & 1) != 0) {
              input_01.upper = *piVar7;
              input_01.lower = ((hugeint_t *)(piVar7 + -1))->lower;
              uVar3 = ExtractVersionUuidOperator::Operation<duckdb::hugeint_t,unsigned_int>
                                (input_01,(Vector *)dataptr);
              result_data[uVar6 + uVar10] = uVar3;
            }
            piVar7 = piVar7 + 2;
          }
        }
      }
      uVar6 = uVar4;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}